

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_embedded.cc
# Opt level: O1

void __thiscall EmbeddedCode::GenCode(EmbeddedCode *this,Output *out,Env *env)

{
  size_type sVar1;
  vector<EmbeddedCodeSegment*,std::allocator<EmbeddedCodeSegment*>> *this_00;
  pointer pcVar2;
  string *psVar3;
  pointer ppEVar4;
  string local_50;
  
  sVar1 = (this->current_segment_)._M_string_length;
  if (sVar1 != 0) {
    this_00 = (vector<EmbeddedCodeSegment*,std::allocator<EmbeddedCodeSegment*>> *)this->segments_;
    psVar3 = (string *)operator_new(0x28);
    *(string **)&psVar3->field_0x0 = psVar3 + 0x10;
    pcVar2 = (this->current_segment_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>(psVar3,pcVar2,pcVar2 + sVar1);
    *(undefined8 *)(psVar3 + 0x20) = 0;
    local_50._M_dataplus._M_p = (pointer)psVar3;
    std::vector<EmbeddedCodeSegment*,std::allocator<EmbeddedCodeSegment*>>::
    emplace_back<EmbeddedCodeSegment*>(this_00,(EmbeddedCodeSegment **)&local_50);
    std::__cxx11::string::_M_replace
              ((ulong)&this->current_segment_,0,(char *)(this->current_segment_)._M_string_length,
               0x13426f);
  }
  env->allow_undefined_id_ = true;
  if ((this->segments_ != (EmbeddedCodeSegmentList *)0x0) &&
     (ppEVar4 = (this->segments_->
                super__Vector_base<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
     ppEVar4 !=
     (this->segments_->
     super__Vector_base<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      EmbeddedCodeSegment::ToCode_abi_cxx11_(&local_50,*ppEVar4,env);
      Output::print(out,"%s",local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      ppEVar4 = ppEVar4 + 1;
    } while (ppEVar4 !=
             (this->segments_->
             super__Vector_base<EmbeddedCodeSegment_*,_std::allocator<EmbeddedCodeSegment_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  env->allow_undefined_id_ = false;
  Output::print(out,"\n");
  return;
}

Assistant:

void EmbeddedCode::GenCode(Output* out, Env* env)
	{
	if ( ! current_segment_.empty() )
		{
		segments_->push_back(new EmbeddedCodeSegment(current_segment_));
		current_segment_ = "";
		}

	// TODO: return to the generated file after embedded code
	// out->print("#line %d \"%s\"\n", line_num, filename.c_str());

	// Allow use of RValue for undefined ID, in which case the
	// ID's name is used as its RValue
	env->set_allow_undefined_id(true);

	foreach (i, EmbeddedCodeSegmentList, segments_)
		{
		EmbeddedCodeSegment* segment = *i;
		out->print("%s", segment->ToCode(env).c_str());
		}

	env->set_allow_undefined_id(false);
	out->print("\n");
	}